

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpu_data.h
# Opt level: O2

void __thiscall dlib::gpu_data::set_size(gpu_data *this,size_t new_size)

{
  void *pvVar1;
  
  if (new_size == 0) {
    this->data_size = 0;
    this->host_current = true;
    this->device_current = true;
    this->device_in_use = false;
    std::__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->data_host).super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>);
  }
  else {
    if (this->data_size == new_size) {
      return;
    }
    this->data_size = new_size;
    this->host_current = true;
    this->device_current = true;
    this->device_in_use = false;
    pvVar1 = operator_new__(-(ulong)(new_size >> 0x3e != 0) | new_size << 2);
    std::__shared_ptr<float,(__gnu_cxx::_Lock_policy)2>::reset<float,std::default_delete<float[]>>
              ((__shared_ptr<float,(__gnu_cxx::_Lock_policy)2> *)&this->data_host,pvVar1);
  }
  std::__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->data_device).super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void set_size(size_t new_size)
        {
            if (new_size == 0)
            {
                data_size = 0;
                host_current = true;
                device_current = true;
                device_in_use = false;
                data_host.reset();
                data_device.reset();
            }
            else if (new_size != data_size)
            {
                data_size = new_size;
                host_current = true;
                device_current = true;
                device_in_use = false;
                data_host.reset(new float[new_size], std::default_delete<float[]>());
                data_device.reset();
            }
        }